

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O1

int64_t __thiscall wasm::Random::get64(Random *this)

{
  uint uVar1;
  int32_t iVar2;
  
  uVar1 = get32(this);
  iVar2 = get32(this);
  return (long)iVar2 | (ulong)uVar1 << 0x20;
}

Assistant:

int64_t Random::get64() {
  auto temp = uint64_t(get32()) << 32;
  return temp | uint64_t(get32());
}